

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cc
# Opt level: O0

int __thiscall brown::App::runGraphics(App *this)

{
  int iVar1;
  App *this_local;
  
  iVar1 = appInit(this);
  if (iVar1 == 0) {
    while (((this->isBreak ^ 0xffU) & 1) != 0) {
      appEventHandle(this);
      iVar1 = beginDraw(this);
      if (iVar1 == 0) {
        Simulator::renderLoop(this->sim,&this->dd);
      }
      endDraw(this);
      SDL_Delay(0x1e);
    }
    appExit(this);
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int App::runGraphics() {
    if (appInit() != 0) {return -1;}
    while (!isBreak) {
        appEventHandle();
        if (beginDraw() == 0) {
            sim.renderLoop(dd);
        }
        endDraw();
        SDL_Delay(30);
    }
    appExit();
    return 0;
}